

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

bool __thiscall
bloaty::RangeSink::ContainsVerboseFileOffset(RangeSink *this,uint64_t fileoff,uint64_t filesize)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((this->options_).verbose_level_ < 2) {
    if ((((this->options_)._has_bits_.has_bits_[0] & 0x80) != 0) &&
       (uVar1 = (this->options_).debug_fileoff_, fileoff <= uVar1)) {
      return uVar1 < filesize + fileoff;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RangeSink::ContainsVerboseFileOffset(uint64_t fileoff, uint64_t filesize) {
  return options_.verbose_level() > 1 ||
         (options_.has_debug_fileoff() && options_.debug_fileoff() >= fileoff &&
          options_.debug_fileoff() < (fileoff + filesize));
}